

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O2

void lexer_error(char *m,char *s,uint row,uint col)

{
  undefined8 uVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  void *__s;
  void *__s_00;
  undefined8 uStack_50;
  undefined8 local_48;
  char *local_40;
  uint local_34;
  
  uStack_50 = 0x102ddc;
  local_48 = s;
  local_40 = m;
  local_34 = row;
  sVar4 = strlen(s);
  uVar5 = (ulong)(col + 2) + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar5;
  __s_00 = (void *)((long)&local_48 + lVar2);
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x102e04;
  memset(__s_00,0,(ulong)(col + 2));
  *(undefined1 *)((long)&local_48 - uVar5) = 10;
  uVar5 = (ulong)col;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x20;
  uVar1 = *(undefined8 *)((long)&uStack_50 + lVar2);
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x102e1b;
  memset((void *)((long)&local_48 + lVar2 + 1),(int)uVar1,uVar5);
  *(undefined1 *)(uVar5 + (long)__s_00) = 0x5e;
  __s = (void *)((long)__s_00 - (uVar5 + 0xf & 0xfffffffffffffff0));
  if (sVar4 < uVar5) {
    *(undefined8 *)((long)__s + -8) = 0x20;
    uVar1 = *(undefined8 *)((long)__s + -8);
    *(undefined8 *)((long)__s + -8) = 0x102e4a;
    memset(__s,(int)uVar1,(uVar5 - sVar4) + 1);
  }
  pcVar3 = local_40;
  uVar5 = (ulong)local_34;
  *(undefined8 *)((long)__s + -8) = 0x102e6c;
  fprintf(_stderr,"%s:(%d, %d)\n",pcVar3,uVar5,(ulong)col);
  pcVar3 = local_48;
  *(undefined8 *)((long)__s + -8) = 0x102e87;
  fprintf(_stderr,"%s%s%s\n",__s,pcVar3,__s_00);
  *(undefined8 *)((long)__s + -8) = 1;
  uVar1 = *(undefined8 *)((long)__s + -8);
  *(code **)((long)__s + -8) = parser_error;
  exit((int)uVar1);
}

Assistant:

void lexer_error(const char *m, const char *s, unsigned int row, unsigned int col) {
    size_t len = strlen(s);
    char buff[col + 2];
    memset(buff, '\0', col + 2);
    memset(buff, '\n', 1);
    memset(buff + 1, ' ', col);
    memset(buff + col, '^', 1);
    char n_buff[col];
    if (col > len) {
        memset(n_buff, ' ', col - len + 1);
    }
    fprintf(stderr, "%s:(%d, %d)\n", m, row, col);
    fprintf(stderr, "%s%s%s\n", n_buff, s, buff);
    exit(1);
}